

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_mulmod(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  mp_int *in_RCX;
  mp_int *in_RDX;
  mp_int *in_RSI;
  mp_int t;
  int res;
  mp_int *in_stack_ffffffffffffffb8;
  mp_int *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  local_4 = mp_init(in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    local_4 = mp_mul(in_RDX,in_RCX,(mp_int *)(ulong)in_stack_ffffffffffffffd0);
    if (local_4 == 0) {
      local_4 = mp_mod(in_RSI,in_RDX,in_RCX);
      mp_clear(in_stack_ffffffffffffffc0);
    }
    else {
      mp_clear(in_stack_ffffffffffffffc0);
    }
  }
  return local_4;
}

Assistant:

int mp_mulmod (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  int     res;
  mp_int  t;

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  if ((res = mp_mul (a, b, &t)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  res = mp_mod (&t, c, d);
  mp_clear (&t);

  return res;
}